

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O3

bool __thiscall
Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
          (Set<Kernel::Variable,_Lib::StlHash> *this,Variable val)

{
  Cell *pCVar1;
  ulong uVar2;
  Cell *pCVar3;
  Variable VVar4;
  uint code;
  uint uVar5;
  
  VVar4._num = 2;
  if (2 < val._num) {
    VVar4._num = val._num;
  }
  pCVar1 = this->_entries;
  uVar2 = (ulong)VVar4._num % (ulong)(uint)this->_capacity;
  uVar5 = pCVar1[uVar2].code;
  if (uVar5 != 0) {
    pCVar3 = pCVar1 + uVar2;
    do {
      if ((uVar5 == VVar4._num) && ((pCVar3->value)._num == val._num)) {
        return true;
      }
      pCVar3 = pCVar3 + 1;
      if (pCVar3 == this->_afterLast) {
        pCVar3 = pCVar1;
      }
      uVar5 = pCVar3->code;
    } while (uVar5 != 0);
  }
  return false;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }